

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

void __thiscall
deqp::gls::FboUtil::ValidStatusCodes::logLegalResults(ValidStatusCodes *this,TestLog *log)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pRVar3;
  char *pcVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  validResults;
  MessageBuilder msg;
  allocator<char> local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [384];
  
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar3 = (this->m_errorCodes).
           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = &local_208.field_2;
  if (0 < (int)((ulong)((long)(this->m_errorCodes).
                              super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) >> 3) *
          -0x49249249) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      pcVar4 = glu::getErrorName(*(int *)((long)&pRVar3->errorCode + lVar9));
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1d0,pcVar4,&local_209);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_1d0);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_208.field_2._M_allocated_capacity = *psVar6;
        local_208.field_2._8_8_ = plVar5[3];
        local_208._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar6;
        local_208._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_208._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
                 &local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_1d0[0] != local_1c0) {
        operator_delete(local_1d0[0],local_1c0[0] + 1);
      }
      lVar8 = lVar8 + 1;
      pRVar3 = (this->m_errorCodes).
               super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x38;
    } while (lVar8 < (int)((ulong)((long)(this->m_errorCodes).
                                         super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3)
                          >> 3) * -0x49249249);
  }
  pRVar3 = (this->m_errorStatuses).
           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_errorStatuses).
                              super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) >> 3) *
          -0x49249249) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      pcVar4 = glu::getFramebufferStatusName(*(int *)((long)&pRVar3->errorCode + lVar8));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,pcVar4,(allocator<char> *)local_1d0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
                 &local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      lVar9 = lVar9 + 1;
      pRVar3 = (this->m_errorStatuses).
               super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x38;
    } while (lVar9 < (int)((ulong)((long)(this->m_errorStatuses).
                                         super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3)
                          >> 3) * -0x49249249);
  }
  if (this->m_allowComplete != false) {
    local_208._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"GL_FRAMEBUFFER_COMPLETE","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
               &local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"Expected ",9);
  uVar10 = (long)local_1e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_1e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < uVar10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"one of ",7);
    uVar10 = (long)local_1e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar10 = uVar10 >> 5;
  if (0 < (int)uVar10) {
    uVar7 = 2;
    lVar8 = 8;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 *(char **)((long)local_1e8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar8 + -8),
                 *(long *)((long)&((local_1e8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar8));
      uVar1 = uVar7 - 1;
      uVar10 = uVar10 & 0xffffffff;
      if (uVar1 != uVar10) {
        pcVar4 = ", ";
        if (uVar7 == uVar10) {
          pcVar4 = " or ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),pcVar4,(ulong)(uVar7 == uVar10) * 2 + 2);
      }
      uVar10 = (ulong)((long)local_1e8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1e8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5;
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x20;
    } while ((long)uVar1 < (long)(int)uVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  return;
}

Assistant:

void ValidStatusCodes::logLegalResults (tcu::TestLog& log) const
{
	tcu::MessageBuilder			msg				(&log);
	std::vector<std::string>	validResults;

	for (int ndx = 0; ndx < (int)m_errorCodes.size(); ++ndx)
		validResults.push_back(std::string(glu::getErrorName(m_errorCodes[ndx].errorCode)) + " (during FBO initialization)");

	for (int ndx = 0; ndx < (int)m_errorStatuses.size(); ++ndx)
		validResults.push_back(glu::getFramebufferStatusName(m_errorStatuses[ndx].errorCode));

	if (m_allowComplete)
		validResults.push_back("GL_FRAMEBUFFER_COMPLETE");

	msg << "Expected ";
	if (validResults.size() > 1)
		msg << "one of ";

	for (int ndx = 0; ndx < (int)validResults.size(); ++ndx)
	{
		const bool last			= ((ndx + 1) == (int)validResults.size());
		const bool secondToLast	= ((ndx + 2) == (int)validResults.size());

		msg << validResults[ndx];
		if (!last)
			msg << ((secondToLast) ? (" or ") : (", "));
	}

	msg << "." << TestLog::EndMessage;
}